

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_codecs.c
# Opt level: O2

cram_codec * cram_huffman_decode_init(char *data,int size,cram_external_type option,int version)

{
  byte bVar1;
  cram_codec *__ptr;
  uint *__base;
  long lVar2;
  ulong uVar3;
  uint *puVar4;
  uint uVar5;
  byte *pbVar6;
  code *pcVar7;
  long lVar8;
  byte *pbVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  size_t __nmemb;
  bool bVar15;
  long lStack_60;
  
  bVar1 = *data;
  uVar5 = (uint)bVar1;
  if (-1 < (char)bVar1) {
    lStack_60 = 1;
    goto LAB_00137c7c;
  }
  uVar11 = (uint)(byte)data[1];
  uVar5 = (uint)bVar1;
  if (bVar1 < 0xc0) {
    lStack_60 = 2;
    uVar5 = (uVar5 & 0x3f) << 8;
  }
  else {
    if (bVar1 < 0xe0) {
      lStack_60 = 3;
      uVar5 = (uVar5 & 0x1f) << 0x10 | uVar11 << 8 | (uint)(byte)data[2];
      goto LAB_00137c7c;
    }
    if (bVar1 < 0xf0) {
      lStack_60 = 4;
      uVar5 = (uVar5 & 0xf) << 0x18 | uVar11 << 0x10 | (uint)(byte)data[2] << 8 |
              (uint)(byte)data[3];
      goto LAB_00137c7c;
    }
    lStack_60 = 5;
    uVar11 = (uint)(byte)data[3] << 4 | (uint)(byte)data[2] << 0xc | uVar11 << 0x14 | uVar5 << 0x1c;
    uVar5 = (byte)data[4] & 0xf;
  }
  uVar5 = uVar5 | uVar11;
LAB_00137c7c:
  __ptr = (cram_codec *)calloc(1,0x240);
  if (__ptr != (cram_codec *)0x0) {
    __ptr->free = cram_huffman_decode_free;
    (__ptr->field_6).huffman.ncodes = uVar5;
    __nmemb = (size_t)(int)uVar5;
    __base = (uint *)malloc(__nmemb << 4);
    (__ptr->field_6).e_byte_array_len.len_dat = __base;
    if (__base != (uint *)0x0) {
      pbVar6 = (byte *)(data + size);
      lVar8 = 0;
      puVar4 = __base;
      for (pbVar9 = (byte *)(data + lStack_60); (lVar8 < (long)__nmemb && (pbVar9 < pbVar6));
          pbVar9 = pbVar9 + lVar2) {
        bVar1 = *pbVar9;
        uVar11 = (uint)bVar1;
        lVar2 = 1;
        if ((char)bVar1 < '\0') {
          uVar13 = (uint)bVar1;
          uVar11 = (uint)pbVar9[1];
          if (bVar1 < 0xc0) {
            uVar11 = (uVar13 & 0x3f) << 8 | uVar11;
            lVar2 = 2;
          }
          else if (bVar1 < 0xe0) {
            uVar11 = (uVar13 & 0x1f) << 0x10 | uVar11 << 8 | (uint)pbVar9[2];
            lVar2 = 3;
          }
          else if (bVar1 < 0xf0) {
            uVar11 = (uVar13 & 0xf) << 0x18 | uVar11 << 0x10 | (uint)pbVar9[2] << 8 |
                     (uint)pbVar9[3];
            lVar2 = 4;
          }
          else {
            uVar11 = pbVar9[4] & 0xf |
                     (uint)pbVar9[3] << 4 | (uint)pbVar9[2] << 0xc | uVar11 << 0x14 | uVar13 << 0x1c
            ;
            lVar2 = 5;
          }
        }
        *puVar4 = uVar11;
        lVar8 = lVar8 + 1;
        puVar4 = puVar4 + 4;
      }
      if (pbVar9 < pbVar6) {
        bVar1 = *pbVar9;
        uVar11 = (uint)bVar1;
        if ((char)bVar1 < '\0') {
          uVar13 = (uint)bVar1;
          uVar11 = (uint)pbVar9[1];
          if (bVar1 < 0xc0) {
            uVar11 = (uVar13 & 0x3f) << 8 | uVar11;
            lStack_60 = 2;
          }
          else if (bVar1 < 0xe0) {
            uVar11 = (uVar13 & 0x1f) << 0x10 | uVar11 << 8 | (uint)pbVar9[2];
            lStack_60 = 3;
          }
          else if (bVar1 < 0xf0) {
            uVar11 = (uVar13 & 0xf) << 0x18 | uVar11 << 0x10 | (uint)pbVar9[2] << 8 |
                     (uint)pbVar9[3];
            lStack_60 = 4;
          }
          else {
            uVar11 = pbVar9[4] & 0xf |
                     (uint)pbVar9[3] << 4 | (uint)pbVar9[2] << 0xc | uVar11 << 0x14 | uVar13 << 0x1c
            ;
            lStack_60 = 5;
          }
        }
        else {
          lStack_60 = 1;
        }
        if (uVar11 == uVar5) {
          if (uVar5 == 0) {
            return __ptr;
          }
          pbVar9 = pbVar9 + lStack_60;
          puVar4 = __base + 3;
          lVar8 = 0;
          uVar11 = 0;
          while ((lVar8 < (long)__nmemb && (pbVar9 < pbVar6))) {
            bVar1 = *pbVar9;
            uVar13 = (uint)bVar1;
            lStack_60 = 1;
            if ((char)bVar1 < '\0') {
              uVar12 = (uint)bVar1;
              uVar13 = (uint)pbVar9[1];
              if (bVar1 < 0xc0) {
                uVar13 = (uVar12 & 0x3f) << 8 | uVar13;
                lStack_60 = 2;
              }
              else if (bVar1 < 0xe0) {
                uVar13 = (uVar12 & 0x1f) << 0x10 | uVar13 << 8 | (uint)pbVar9[2];
                lStack_60 = 3;
              }
              else if (bVar1 < 0xf0) {
                uVar13 = (uVar12 & 0xf) << 0x18 | uVar13 << 0x10 | (uint)pbVar9[2] << 8 |
                         (uint)pbVar9[3];
                lStack_60 = 4;
              }
              else {
                uVar13 = pbVar9[4] & 0xf |
                         (uint)pbVar9[3] << 4 |
                         (uint)pbVar9[2] << 0xc | uVar13 << 0x14 | uVar12 << 0x1c;
                lStack_60 = 5;
              }
            }
            *puVar4 = uVar13;
            pbVar9 = pbVar9 + lStack_60;
            if ((int)uVar11 <= (int)uVar13) {
              uVar11 = uVar13;
            }
            lVar8 = lVar8 + 1;
            puVar4 = puVar4 + 4;
          }
          if (((long)pbVar9 - (long)data == (long)size) && ((int)uVar11 < (int)uVar5)) {
            qsort(__base,__nmemb,0x10,code_sort);
            uVar3 = 0;
            uVar14 = (ulong)uVar5;
            if ((int)uVar5 < 1) {
              uVar14 = uVar3;
            }
            uVar5 = 0xffffffff;
            uVar11 = 0;
            for (; uVar3 != uVar14; uVar3 = uVar3 + 1) {
              uVar5 = uVar5 + 1;
              uVar13 = __base[uVar3 * 4 + 3];
              iVar10 = uVar13 - uVar11;
              if (iVar10 != 0 && (int)uVar11 <= (int)uVar13) {
                while (bVar15 = iVar10 != 0, iVar10 = iVar10 + -1, uVar11 = uVar13, bVar15) {
                  uVar5 = uVar5 * 2;
                }
              }
              __base[uVar3 * 4 + 2] = uVar5;
            }
            puVar4 = __base + 3;
            uVar11 = 0;
            uVar5 = 0;
            for (lVar8 = 0; -lVar8 != uVar14; lVar8 = lVar8 + -1) {
              if ((int)uVar5 < (int)*puVar4) {
                uVar11 = puVar4[-1] + (int)lVar8;
                uVar5 = *puVar4;
              }
              puVar4[-2] = uVar11;
              puVar4 = puVar4 + 4;
            }
            __ptr->codec = E_HUFFMAN;
            if (option - E_BYTE < 2) {
              if (__base[3] == 0) {
                pcVar7 = cram_huffman_decode_char0;
              }
              else {
                pcVar7 = cram_huffman_decode_char;
              }
            }
            else {
              if (option == E_BYTE_ARRAY_BLOCK) {
                abort();
              }
              if (__base[3] == 0) {
                pcVar7 = cram_huffman_decode_int0;
              }
              else {
                pcVar7 = cram_huffman_decode_int;
              }
            }
            __ptr->decode = pcVar7;
            return __ptr;
          }
        }
      }
      fwrite("Malformed huffman header stream\n",0x20,1,_stderr);
    }
    free(__ptr);
  }
  return (cram_codec *)0x0;
}

Assistant:

cram_codec *cram_huffman_decode_init(char *data, int size,
				     enum cram_external_type option,
				     int version) {
    int32_t ncodes, i, j;
    char *cp = data, *data_end = &data[size];
    cram_codec *h;
    cram_huffman_code *codes;
    int32_t val, last_len, max_len = 0;
    
    cp += itf8_get(cp, &ncodes);
    h = calloc(1, sizeof(*h));
    if (!h)
	return NULL;

    h->free   = cram_huffman_decode_free;

    h->huffman.ncodes = ncodes;
    codes = h->huffman.codes = malloc(ncodes * sizeof(*codes));
    if (!codes) {
	free(h);
	return NULL;
    }

    /* Read symbols and bit-lengths */
    for (i = 0; i < ncodes && cp < data_end; i++) {
	cp += itf8_get(cp, &codes[i].symbol);
    }

    if (cp >= data_end) {
	fprintf(stderr, "Malformed huffman header stream\n");
	free(h);
	return NULL;
    }
    cp += itf8_get(cp, &i);
    if (i != ncodes) {
	fprintf(stderr, "Malformed huffman header stream\n");
	free(h);
	return NULL;
    }

    if (ncodes == 0) {
	/* NULL huffman stream */
	return h;
    }

    for (i = 0; i < ncodes && cp < data_end; i++) {
	cp += itf8_get(cp, &codes[i].len);
	if (max_len < codes[i].len)
	    max_len = codes[i].len;
    }
    if (cp - data != size || max_len >= ncodes) {
	fprintf(stderr, "Malformed huffman header stream\n");
	free(h);
	return NULL;
    }

    /* Sort by bit length and then by symbol value */
    qsort(codes, ncodes, sizeof(*codes), code_sort);

    /* Assign canonical codes */
    val = -1, last_len = 0;
    for (i = 0; i < ncodes; i++) {
	val++;
	if (codes[i].len > last_len) {
	    while (codes[i].len > last_len) {
		val <<= 1;
		last_len++;
	    }
	}
	codes[i].code = val;
    }

    /*
     * Compute the next starting point, offset by the i'th value.
     * For example if codes 10, 11, 12, 13 are 30, 31, 32, 33 then
     * codes[10..13].p = 30 - 10.
     */
    last_len = 0;
    for (i = j = 0; i < ncodes; i++) {
	if (codes[i].len > last_len) {
	    j = codes[i].code - i;
	    last_len = codes[i].len;
	}
	codes[i].p = j;
    }

//    puts("==HUFF LEN==");
//    for (i = 0; i <= last_len+1; i++) {
//	printf("len %d=%d prefix %d\n", i, h->huffman.lengths[i], h->huffman.prefix[i]); 
//    }
//    puts("===HUFFMAN CODES===");
//    for (i = 0; i < ncodes; i++) {
//	int j;
//	printf("%d: %d %d %d ", i, codes[i].symbol, codes[i].len, codes[i].code);
//	j = codes[i].len;
//	while (j) {
//	    putchar(codes[i].code & (1 << --j) ? '1' : '0');
//	}
//	printf(" %d\n", codes[i].code);
//    }

    h->codec  = E_HUFFMAN;
    if (option == E_BYTE || option == E_BYTE_ARRAY) {
	if (h->huffman.codes[0].len == 0)
	    h->decode = cram_huffman_decode_char0;
	else
	    h->decode = cram_huffman_decode_char;
    } else if (option == E_BYTE_ARRAY_BLOCK) {
	abort();
    } else {
	if (h->huffman.codes[0].len == 0)
	    h->decode = cram_huffman_decode_int0;
	else
	    h->decode = cram_huffman_decode_int;
    }

    return (cram_codec *)h;
}